

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseUIComponent.cpp
# Opt level: O2

void __thiscall nite::NavUI::update(NavUI *this,BaseUIComponent *comp)

{
  NavUI **key;
  byte bVar1;
  pointer psVar2;
  long *plVar3;
  element_type *peVar4;
  NavUI *pNVar5;
  byte bVar6;
  bool bVar7;
  uint key_00;
  ListenerInfo *__p;
  int iVar8;
  int iVar9;
  __node_base *p_Var10;
  long lVar11;
  int i;
  ulong uVar12;
  float Step;
  BaseUIComponent *local_98;
  anon_class_16_2_3ef9e608 getSelectedChild;
  __shared_ptr<nite::ListenerInfo,(__gnu_cxx::_Lock_policy)2> local_68 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_60;
  NavUI *local_58;
  undefined1 local_50 [8];
  anon_class_16_2_044dc475 solveAutoScroll;
  BaseUIComponent *local_38;
  BaseUIComponent *comp_local;
  
  if (comp == (BaseUIComponent *)0x0) {
    return;
  }
  local_98 = (BaseUIComponent *)&stack0xffffffffffffffc8;
  solveAutoScroll.comp = &local_98;
  if (this->colorFlip == 0) {
    Step = 0.11;
  }
  else {
    Step = 0.34;
  }
  getSelectedChild.comp = (BaseUIComponent **)this;
  local_58 = this;
  local_50 = (undefined1  [8])local_98;
  local_38 = comp;
  solveAutoScroll.getSelectedChild._7_1_ =
       Color::cInterpDiscrete
                 (&this->color,(Color *)((long)&(this->a).r + (ulong)((this->colorFlip ^ 1) << 4)),
                  Step);
  if (local_38->visible == true) {
    p_Var10 = &(local_38->keyListeners)._M_h._M_before_begin;
    key = &getSelectedChild.this;
    while (p_Var10 = p_Var10->_M_nxt, p_Var10 != (__node_base *)0x0) {
      std::__cxx11::string::string((string *)key,(string *)(p_Var10 + 1));
      key_00 = translateKey((string *)key);
      bVar7 = keyboardPressed(key_00);
      std::__cxx11::string::~string((string *)key);
      if (bVar7) {
        __p = (ListenerInfo *)operator_new(1);
        std::__shared_ptr<nite::ListenerInfo,(__gnu_cxx::_Lock_policy)2>::
        __shared_ptr<nite::ListenerInfo,void>(local_68,__p);
        std::function<void_(const_std::shared_ptr<nite::ListenerInfo>_&,_nite::BaseUIComponent_*)>::
        operator()((function<void_(const_std::shared_ptr<nite::ListenerInfo>_&,_nite::BaseUIComponent_*)>
                    *)(p_Var10 + 5),(shared_ptr<nite::ListenerInfo> *)local_68,local_38);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_60);
      }
    }
  }
  bVar6 = solveAutoScroll.getSelectedChild._7_1_;
  pNVar5 = local_58;
  bVar1 = local_58->enable;
  if ((solveAutoScroll.getSelectedChild._7_1_ & bVar1) == 1) {
    local_58->colorFlip = (bool)(local_58->colorFlip ^ 1);
    (*local_38->_vptr_BaseUIComponent[7])();
    bVar1 = pNVar5->enable;
  }
  if (((bVar6 | ~bVar1) & 1) == 0) {
    (*local_38->_vptr_BaseUIComponent[7])();
    bVar1 = pNVar5->enable;
  }
  if (((bVar1 & 1) != 0) && (bVar7 = keyboardPressed(local_38->onClickAnalogueKey), bVar7)) {
    lVar11 = 0;
    for (uVar12 = 0;
        psVar2 = (local_38->children).
                 super__Vector_base<std::shared_ptr<nite::BaseUIComponent>,_std::allocator<std::shared_ptr<nite::BaseUIComponent>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
        uVar12 < (ulong)((long)(local_38->children).
                               super__Vector_base<std::shared_ptr<nite::BaseUIComponent>,_std::allocator<std::shared_ptr<nite::BaseUIComponent>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish - (long)psVar2 >> 4);
        uVar12 = uVar12 + 1) {
      plVar3 = *(long **)((long)&(psVar2->
                                 super___shared_ptr<nite::BaseUIComponent,_(__gnu_cxx::_Lock_policy)2>
                                 )._M_ptr + lVar11);
      if ((int)plVar3[0xc] == pNVar5->current) {
        (**(code **)(*plVar3 + 0x50))();
      }
      lVar11 = lVar11 + 0x10;
    }
  }
  if ((pNVar5->enable == true) && (bVar7 = keyboardPressed(0x48), bVar7)) {
    peVar4 = (local_38->layout).super___shared_ptr<nite::LayoutSystemUI,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    bVar7 = peVar4->yorient;
    if (peVar4->xorient == true) {
      if (bVar7 == false) {
LAB_001ba118:
        uVar12 = (long)pNVar5->current + 1;
        iVar9 = (int)uVar12;
        if ((ulong)((long)(local_38->children).
                          super__Vector_base<std::shared_ptr<nite::BaseUIComponent>,_std::allocator<std::shared_ptr<nite::BaseUIComponent>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(local_38->children).
                          super__Vector_base<std::shared_ptr<nite::BaseUIComponent>,_std::allocator<std::shared_ptr<nite::BaseUIComponent>_>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 4) <= uVar12) {
          iVar9 = pNVar5->current;
        }
        pNVar5->current = iVar9;
      }
      else if (pNVar5->split != 0) {
        iVar9 = pNVar5->current;
        uVar12 = (long)iVar9 + 1;
        iVar8 = iVar9;
        if (((int)((long)((ulong)(uint)((int)uVar12 >> 0x1f) << 0x20 | uVar12 & 0xffffffff) %
                  (long)pNVar5->split) != 0) &&
           (iVar8 = (int)uVar12,
           ((long)(local_38->children).
                  super__Vector_base<std::shared_ptr<nite::BaseUIComponent>,_std::allocator<std::shared_ptr<nite::BaseUIComponent>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(local_38->children).
                  super__Vector_base<std::shared_ptr<nite::BaseUIComponent>,_std::allocator<std::shared_ptr<nite::BaseUIComponent>_>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 4) - 1U < uVar12)) {
          iVar8 = iVar9;
        }
        pNVar5->current = iVar8;
      }
    }
    else if (bVar7 != false) goto LAB_001ba118;
    update::anon_class_16_2_044dc475::operator()((anon_class_16_2_044dc475 *)local_50);
    (*local_38->_vptr_BaseUIComponent[7])();
  }
  if ((pNVar5->enable == true) && (bVar7 = keyboardPressed(0x47), bVar7)) {
    peVar4 = (local_38->layout).super___shared_ptr<nite::LayoutSystemUI,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    bVar7 = peVar4->yorient;
    if (peVar4->xorient == true) {
      if (bVar7 == false) {
LAB_001ba1a6:
        pNVar5->current = pNVar5->current - (uint)(0 < pNVar5->current);
      }
      else if (pNVar5->split != 0) {
        iVar9 = pNVar5->current;
        pNVar5->current = iVar9 + -1;
        if ((iVar9 < 1) || (iVar9 % pNVar5->split == 0)) {
          pNVar5->current = iVar9;
        }
      }
    }
    else if (bVar7 != false) goto LAB_001ba1a6;
    update::anon_class_16_2_044dc475::operator()((anon_class_16_2_044dc475 *)local_50);
    (*local_38->_vptr_BaseUIComponent[7])();
  }
  if ((pNVar5->enable == true) && (bVar7 = keyboardPressed(0x4a), bVar7)) {
    peVar4 = (local_38->layout).super___shared_ptr<nite::LayoutSystemUI,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    bVar7 = peVar4->yorient;
    if (peVar4->xorient == true) {
      if (bVar7 == false) {
LAB_001ba236:
        pNVar5->current =
             pNVar5->current +
             (uint)((long)pNVar5->index + 1U <
                   (ulong)((long)(local_38->children).
                                 super__Vector_base<std::shared_ptr<nite::BaseUIComponent>,_std::allocator<std::shared_ptr<nite::BaseUIComponent>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(local_38->children).
                                 super__Vector_base<std::shared_ptr<nite::BaseUIComponent>,_std::allocator<std::shared_ptr<nite::BaseUIComponent>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start >> 4));
      }
      else if (pNVar5->split != 0) {
        iVar9 = pNVar5->current;
        iVar8 = pNVar5->split + iVar9;
        pNVar5->current = iVar8;
        if (((long)(local_38->children).
                   super__Vector_base<std::shared_ptr<nite::BaseUIComponent>,_std::allocator<std::shared_ptr<nite::BaseUIComponent>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(local_38->children).
                   super__Vector_base<std::shared_ptr<nite::BaseUIComponent>,_std::allocator<std::shared_ptr<nite::BaseUIComponent>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 4) - 1U < (ulong)(long)iVar8) {
          pNVar5->current = iVar9;
        }
      }
    }
    else if (bVar7 != false) goto LAB_001ba236;
    update::anon_class_16_2_044dc475::operator()((anon_class_16_2_044dc475 *)local_50);
    (*local_38->_vptr_BaseUIComponent[7])();
  }
  if (pNVar5->enable != true) {
    return;
  }
  bVar7 = keyboardPressed(0x49);
  if (!bVar7) {
    return;
  }
  peVar4 = (local_38->layout).super___shared_ptr<nite::LayoutSystemUI,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  bVar7 = peVar4->yorient;
  if (peVar4->xorient == true) {
    if (bVar7 != false) {
      if (pNVar5->split != 0) {
        iVar9 = pNVar5->current - pNVar5->split;
        if (iVar9 < 0) {
          iVar9 = pNVar5->current;
        }
        pNVar5->current = iVar9;
      }
      goto LAB_001ba2be;
    }
  }
  else if (bVar7 == false) goto LAB_001ba2be;
  pNVar5->current = pNVar5->current - (uint)(0 < pNVar5->index);
LAB_001ba2be:
  update::anon_class_16_2_044dc475::operator()((anon_class_16_2_044dc475 *)local_50);
  (*local_38->_vptr_BaseUIComponent[7])();
  return;
}

Assistant:

void nite::NavUI::update(BaseUIComponent *comp){
    if(comp == NULL){
        return;
    }

    auto getSelectedChild = [&](){
        for(int i = 0; i < comp->children.size(); ++i){
            if(comp->children[i]->nav.index == current){
                return comp->children[i];
            }
        }
        return Shared<nite::BaseUIComponent>(NULL);
    };

    auto solveAutoScroll = [&](){
        if(!comp->allowOverflow){
            return;
        }
        auto child = getSelectedChild();
        if(child.get() == NULL){
            return;
        }
        auto space = comp->computeSize();
        auto area = child->computeSize();
        auto p = child->position + comp->scrollOffset;
        if( p.x + area.x * 0.5f <= 0.0f || p.y + area.y * 0.5f <= 0.0f || 
            p.x - area.x * 0.5f >= space.x || p.y - area.y * 0.5f >= space.y ||
            p.x - area.x * 0.5f < 0.0f || p.y - area.y * 0.5f < 0.0f || 
            p.x + area.x * 0.5f > space.x || p.y + area.y * 0.5f > space.y){
            // TODO: this is going to change to accodomate vinline (instead of left to right, top to bottom)
            // see commented line below
            comp->scrollOffset.y = -(child->position.y - area.y * 0.5f) + area.y;
            //comp->scrollOffset.x = -(child->position.x - area.x * 0.5f);
            comp->recalculate();
        }        
    };

	auto lrpUpd = color.cInterpDiscrete(colorFlip ? a : b, colorFlip ? 0.34f : 0.11f);

	if(comp->visible){
		for(auto &key : comp->keyListeners){
			if(nite::keyboardPressed(nite::translateKey(key.first))){
				key.second(Shared<nite::ListenerInfo>(new nite::ListenerInfo()), comp);
			}
		}		
	}

	if(enable && lrpUpd){
		colorFlip = !colorFlip;
		comp->recalculate();
	}

	if(enable && !lrpUpd){
		comp->recalculate();	
	}

	if(enable && nite::keyboardPressed(comp->onClickAnalogueKey)){
		for(int i = 0; i < comp->children.size(); ++i){
			if(comp->children[i]->nav.index == current){
				comp->children[i]->onClick();
			}
		}
	}

	if(enable && nite::keyboardPressed(nite::keyRIGHT)){
		if(comp->layout->xorient && !comp->layout->yorient || !comp->layout->xorient && comp->layout->yorient){
			current = current+1 >= comp->children.size() ? current : current + 1;
		}else
		if(comp->layout->xorient && comp->layout->yorient && split != 0){
			current = (current + 1) % split == 0 || (current + 1) > comp->children.size()-1 ? current : current + 1;
		}		
        solveAutoScroll();
		comp->recalculate();
	}

	if(enable && nite::keyboardPressed(nite::keyLEFT)){
		if(comp->layout->xorient && !comp->layout->yorient || !comp->layout->xorient && comp->layout->yorient){
			current = current-1 < 0 ? current : current - 1;
		}else
		if(comp->layout->xorient && comp->layout->yorient && split != 0){
			--current;
			if(current < 0 || (current + 1) % split == 0){
				++current;
			}
		}		
        solveAutoScroll();
		comp->recalculate();
	}

	if(enable && nite::keyboardPressed(nite::keyDOWN)){
		if(comp->layout->xorient && !comp->layout->yorient || !comp->layout->xorient && comp->layout->yorient){
			current = index+1 >= comp->children.size() ? current : current + 1;
		}else
		if(comp->layout->xorient && comp->layout->yorient && split != 0){
			current += split;
			if(current > comp->children.size()-1){
				current -= split;
			}
		}		
        solveAutoScroll();
		comp->recalculate();
	}	


	if(enable && nite::keyboardPressed(nite::keyUP)){
		if(comp->layout->xorient && !comp->layout->yorient || !comp->layout->xorient && comp->layout->yorient){
			current = index-1 < 0 ? current : current - 1;
		}else
		if(comp->layout->xorient && comp->layout->yorient && split != 0){
			current -= split;
			if(current < 0){
				current += split;
			}
		}	      
        solveAutoScroll();	
		comp->recalculate();
	}
}